

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  mbedtls_md_info_t *md_info;
  FILE *__stream;
  FILE *pFVar4;
  FILE *__stream_00;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  uchar *puVar12;
  char *pcVar13;
  bool bVar14;
  size_t sStack_7f0;
  uint n;
  FILE *local_7e0;
  long local_7d8;
  ulong local_7d0;
  FILE *local_7c8;
  ulong local_7c0;
  byte local_7b8 [8];
  undefined7 uStack_7b0;
  byte bStack_7a9;
  mbedtls_md_context_t sha_ctx;
  byte local_788 [8];
  uchar auStack_780 [24];
  uchar tmp [16];
  mbedtls_aes_context aes_ctx;
  uchar key [512];
  uchar buffer [1024];
  
  mbedtls_aes_init(&aes_ctx);
  mbedtls_md_init(&sha_ctx);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  iVar2 = mbedtls_md_setup(&sha_ctx,md_info,1);
  if (iVar2 != 0) {
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
    goto LAB_00103b10;
  }
  if (argc == 5) {
    uVar3 = atoi(argv[1]);
    iVar2 = 0;
    memset(key,0,0x200);
    local_788[0] = '\0';
    local_788[1] = '\0';
    local_788[2] = '\0';
    local_788[3] = '\0';
    local_788[4] = '\0';
    local_788[5] = '\0';
    local_788[6] = '\0';
    local_788[7] = '\0';
    auStack_780[0] = '\0';
    auStack_780[1] = '\0';
    auStack_780[2] = '\0';
    auStack_780[3] = '\0';
    auStack_780[4] = '\0';
    auStack_780[5] = '\0';
    auStack_780[6] = '\0';
    auStack_780[7] = '\0';
    auStack_780[8] = '\0';
    auStack_780[9] = '\0';
    auStack_780[10] = '\0';
    auStack_780[0xb] = '\0';
    auStack_780[0xc] = '\0';
    auStack_780[0xd] = '\0';
    auStack_780[0xe] = '\0';
    auStack_780[0xf] = '\0';
    auStack_780[0x10] = '\0';
    auStack_780[0x11] = '\0';
    auStack_780[0x12] = '\0';
    auStack_780[0x13] = '\0';
    auStack_780[0x14] = '\0';
    auStack_780[0x15] = '\0';
    auStack_780[0x16] = '\0';
    auStack_780[0x17] = '\0';
    puVar12 = buffer;
    memset(puVar12,0,0x400);
    if (1 < uVar3) {
      fwrite("invalide operation mode\n",0x18,1,_stderr);
      goto LAB_00103b10;
    }
    pcVar13 = argv[2];
    iVar2 = strcmp(pcVar13,argv[3]);
    if (iVar2 != 0) {
      __stream = fopen(pcVar13,"rb");
      if (__stream == (FILE *)0x0) {
        iVar2 = 0;
        fprintf(_stderr,"fopen(%s,rb) failed\n",argv[2]);
        goto LAB_00103b10;
      }
      pFVar4 = fopen(argv[3],"wb+");
      if (pFVar4 == (FILE *)0x0) {
        fprintf(_stderr,"fopen(%s,wb+) failed\n",argv[3]);
      }
      else {
        __stream_00 = fopen(argv[4],"rb");
        local_7e0 = pFVar4;
        if (__stream_00 == (FILE *)0x0) {
          piVar11 = (int *)argv[4];
          if (*piVar11 == 0x3a786568) {
            local_7d8 = CONCAT44(local_7d8._4_4_,uVar3);
            piVar11 = piVar11 + 1;
            local_7d0 = 0;
            while ((iVar2 = __isoc99_sscanf(piVar11,"%02X",&n), 0 < iVar2 && (local_7d0 < 0x200))) {
              key[local_7d0] = (uchar)n;
              local_7d0 = local_7d0 + 1;
              piVar11 = (int *)((long)piVar11 + 2);
            }
            pFVar4 = local_7e0;
            uVar3 = (uint)local_7d8;
          }
          else {
            sVar5 = strlen((char *)piVar11);
            local_7d0 = 0x200;
            if (sVar5 < 0x200) {
              local_7d0 = sVar5;
            }
            memcpy(key,piVar11,local_7d0);
          }
        }
        else {
          local_7d0 = fread(key,1,0x200,__stream_00);
          fclose(__stream_00);
        }
        pcVar13 = argv[4];
        sVar5 = strlen(pcVar13);
        memset(pcVar13,0,sVar5);
        iVar2 = fileno(__stream);
        uVar6 = lseek(iVar2,0,2);
        if ((long)uVar6 < 0) {
          perror("lseek");
        }
        else {
          iVar2 = fseek(__stream,0,0);
          if (iVar2 < 0) {
            pcVar13 = "fseek(0,SEEK_SET) failed\n";
            sStack_7f0 = 0x19;
          }
          else {
            local_7c8 = __stream;
            local_7c0 = uVar6;
            if ((uVar3 & 1) == 0) {
              for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 8) {
                *puVar12 = (uchar)(uVar6 >> ((byte)lVar9 & 0x3f));
                puVar12 = puVar12 + 1;
              }
              local_7d8 = CONCAT44(local_7d8._4_4_,uVar3);
              puVar12 = (uchar *)argv[2];
              mbedtls_md_starts(&sha_ctx);
              mbedtls_md_update(&sha_ctx,buffer,8);
              sVar5 = strlen((char *)puVar12);
              mbedtls_md_update(&sha_ctx,puVar12,sVar5);
              mbedtls_md_finish(&sha_ctx,local_788);
              local_7b8[0] = local_788[0];
              local_7b8[1] = local_788[1];
              local_7b8[2] = local_788[2];
              local_7b8[3] = local_788[3];
              local_7b8[4] = local_788[4];
              local_7b8[5] = local_788[5];
              local_7b8[6] = local_788[6];
              local_7b8[7] = local_788[7];
              bStack_7a9 = SUB81(auStack_780._0_8_,7);
              uStack_7b0 = (undefined7)auStack_780._0_8_;
              bStack_7a9 = bStack_7a9 & 0xf0 | (byte)local_7c0 & 0xf;
              sVar5 = fwrite(local_7b8,1,0x10,pFVar4);
              if (sVar5 == 0x10) {
                auStack_780[8] = '\0';
                auStack_780[9] = '\0';
                auStack_780[10] = '\0';
                auStack_780[0xb] = '\0';
                auStack_780[0xc] = '\0';
                auStack_780[0xd] = '\0';
                auStack_780[0xe] = '\0';
                auStack_780[0xf] = '\0';
                auStack_780[0x10] = '\0';
                auStack_780[0x11] = '\0';
                auStack_780[0x12] = '\0';
                auStack_780[0x13] = '\0';
                auStack_780[0x14] = '\0';
                auStack_780[0x15] = '\0';
                auStack_780[0x16] = '\0';
                auStack_780[0x17] = '\0';
                local_788[0] = local_7b8[0];
                local_788[1] = local_7b8[1];
                local_788[2] = local_7b8[2];
                local_788[3] = local_7b8[3];
                local_788[4] = local_7b8[4];
                local_788[5] = local_7b8[5];
                local_788[6] = local_7b8[6];
                local_788[7] = local_7b8[7];
                auStack_780[0] = (uchar)uStack_7b0;
                auStack_780[1] = uStack_7b0._1_1_;
                auStack_780[2] = uStack_7b0._2_1_;
                auStack_780[3] = uStack_7b0._3_1_;
                auStack_780[4] = uStack_7b0._4_1_;
                auStack_780[5] = uStack_7b0._5_1_;
                auStack_780[6] = uStack_7b0._6_1_;
                auStack_780[7] = bStack_7a9;
                iVar2 = 0x2000;
                while (bVar14 = iVar2 != 0, iVar2 = iVar2 + -1, bVar14) {
                  mbedtls_md_starts(&sha_ctx);
                  mbedtls_md_update(&sha_ctx,local_788,0x20);
                  mbedtls_md_update(&sha_ctx,key,local_7d0);
                  mbedtls_md_finish(&sha_ctx,local_788);
                }
                memset(key,0,0x200);
                mbedtls_aes_setkey_enc(&aes_ctx,local_788,0x100);
                mbedtls_md_hmac_starts(&sha_ctx,local_788,0x20);
                __stream = local_7c8;
                for (lVar9 = 0; uVar6 = local_7c0 - lVar9, uVar6 != 0 && lVar9 <= (long)local_7c0;
                    lVar9 = lVar9 + 0x10) {
                  if (0xf < (long)uVar6) {
                    uVar6 = 0x10;
                  }
                  n = (uint)uVar6;
                  sVar5 = fread(buffer,1,uVar6 & 0xffffffff,__stream);
                  uVar6 = (ulong)n;
                  if (sVar5 != uVar6) {
                    pcVar13 = "fread(%d bytes) failed\n";
LAB_00103aed:
                    fprintf(_stderr,pcVar13,uVar6);
                    pFVar4 = local_7e0;
                    goto LAB_00103af9;
                  }
                  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
                    buffer[lVar7] = buffer[lVar7] ^ local_7b8[lVar7];
                  }
                  mbedtls_aes_crypt_ecb(&aes_ctx,1,buffer,buffer);
                  mbedtls_md_hmac_update(&sha_ctx,buffer,0x10);
                  sVar5 = fwrite(buffer,1,0x10,local_7e0);
                  if (sVar5 != 0x10) {
                    pcVar13 = "fwrite(%d bytes) failed\n";
                    uVar6 = 0x10;
                    goto LAB_00103aed;
                  }
                  local_7b8[0] = buffer[0];
                  local_7b8[1] = buffer[1];
                  local_7b8[2] = buffer[2];
                  local_7b8[3] = buffer[3];
                  local_7b8[4] = buffer[4];
                  local_7b8[5] = buffer[5];
                  local_7b8[6] = buffer[6];
                  local_7b8[7] = buffer[7];
                  uStack_7b0._0_1_ = buffer[8];
                  uStack_7b0._1_1_ = buffer[9];
                  uStack_7b0._2_1_ = buffer[10];
                  uStack_7b0._3_1_ = buffer[0xb];
                  uStack_7b0._4_1_ = buffer[0xc];
                  uStack_7b0._5_1_ = buffer[0xd];
                  uStack_7b0._6_1_ = buffer[0xe];
                  bStack_7a9 = buffer[0xf];
                }
                mbedtls_md_hmac_finish(&sha_ctx,local_788);
                pFVar4 = local_7e0;
                sVar5 = fwrite(local_788,1,0x20,local_7e0);
                if (sVar5 == 0x20) {
                  if ((uint)local_7d8 != 1) goto LAB_00103af9;
                  goto LAB_00103730;
                }
              }
              pcVar13 = "fwrite(%d bytes) failed\n";
LAB_00103a83:
              sStack_7f0 = 0x10;
LAB_00103abc:
              fprintf(_stderr,pcVar13,sStack_7f0);
              goto LAB_00103af9;
            }
LAB_00103730:
            uVar6 = local_7c0;
            if ((long)local_7c0 < 0x30) {
              pcVar13 = "File too short to be encrypted.\n";
            }
            else {
              if ((local_7c0 & 0xf) == 0) {
                sVar5 = fread(buffer,1,0x10,__stream);
                if (sVar5 == 0x10) {
                  local_7d8 = uVar6 - 0x30;
                  local_7b8[0] = buffer[0];
                  local_7b8[1] = buffer[1];
                  local_7b8[2] = buffer[2];
                  local_7b8[3] = buffer[3];
                  local_7b8[4] = buffer[4];
                  local_7b8[5] = buffer[5];
                  local_7b8[6] = buffer[6];
                  local_7b8[7] = buffer[7];
                  uStack_7b0._0_1_ = buffer[8];
                  uStack_7b0._1_1_ = buffer[9];
                  uStack_7b0._2_1_ = buffer[10];
                  uStack_7b0._3_1_ = buffer[0xb];
                  uStack_7b0._4_1_ = buffer[0xc];
                  uStack_7b0._5_1_ = buffer[0xd];
                  uStack_7b0._6_1_ = buffer[0xe];
                  bStack_7a9 = buffer[0xf];
                  uVar1 = _uStack_7b0;
                  bStack_7a9 = SUB81(buffer._8_8_,7);
                  uVar3 = (uint)bStack_7a9;
                  auStack_780[8] = '\0';
                  auStack_780[9] = '\0';
                  auStack_780[10] = '\0';
                  auStack_780[0xb] = '\0';
                  auStack_780[0xc] = '\0';
                  auStack_780[0xd] = '\0';
                  auStack_780[0xe] = '\0';
                  auStack_780[0xf] = '\0';
                  auStack_780[0x10] = '\0';
                  auStack_780[0x11] = '\0';
                  auStack_780[0x12] = '\0';
                  auStack_780[0x13] = '\0';
                  auStack_780[0x14] = '\0';
                  auStack_780[0x15] = '\0';
                  auStack_780[0x16] = '\0';
                  auStack_780[0x17] = '\0';
                  local_788[0] = buffer[0];
                  local_788[1] = buffer[1];
                  local_788[2] = buffer[2];
                  local_788[3] = buffer[3];
                  local_788[4] = buffer[4];
                  local_788[5] = buffer[5];
                  local_788[6] = buffer[6];
                  local_788[7] = buffer[7];
                  auStack_780[0] = buffer[8];
                  auStack_780[1] = buffer[9];
                  auStack_780[2] = buffer[10];
                  auStack_780[3] = buffer[0xb];
                  auStack_780[4] = buffer[0xc];
                  auStack_780[5] = buffer[0xd];
                  auStack_780[6] = buffer[0xe];
                  auStack_780[7] = buffer[0xf];
                  iVar2 = 0x2000;
                  _uStack_7b0 = uVar1;
                  while (bVar14 = iVar2 != 0, iVar2 = iVar2 + -1, bVar14) {
                    mbedtls_md_starts(&sha_ctx);
                    mbedtls_md_update(&sha_ctx,local_788,0x20);
                    mbedtls_md_update(&sha_ctx,key,local_7d0);
                    mbedtls_md_finish(&sha_ctx,local_788);
                  }
                  uVar6 = 0;
                  memset(key,0,0x200);
                  mbedtls_aes_setkey_dec(&aes_ctx,local_788,0x100);
                  mbedtls_md_hmac_starts(&sha_ctx,local_788,0x20);
                  local_7c0 = local_7c0 - 0x40;
LAB_0010383a:
                  if ((long)uVar6 < local_7d8) {
                    sVar5 = fread(buffer,1,0x10,local_7c8);
                    if (sVar5 == 0x10) goto code_r0x00103862;
                    pcVar13 = "fread(%d bytes) failed\n";
                    uVar10 = 0x10;
                    goto LAB_00103a9b;
                  }
                  mbedtls_md_hmac_finish(&sha_ctx,local_788);
                  __stream = local_7c8;
                  sVar5 = fread(buffer,1,0x20,local_7c8);
                  pFVar4 = local_7e0;
                  if (sVar5 == 0x20) {
                    bVar8 = 0;
                    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
                      bVar8 = bVar8 | buffer[lVar9] ^ local_788[lVar9];
                    }
                    if (bVar8 != 0) {
                      pcVar13 = "HMAC check failed: wrong key, or file corrupted.\n";
                      sStack_7f0 = 0x31;
                      goto LAB_00103a64;
                    }
                    goto LAB_00103af9;
                  }
                  pcVar13 = "fread(%d bytes) failed\n";
                  sStack_7f0 = 0x20;
                  goto LAB_00103abc;
                }
                pcVar13 = "fread(%d bytes) failed\n";
                goto LAB_00103a83;
              }
              pcVar13 = "File size not a multiple of 16.\n";
            }
            sStack_7f0 = 0x20;
          }
LAB_00103a64:
          fwrite(pcVar13,sStack_7f0,1,_stderr);
        }
      }
LAB_00103af9:
      fclose(__stream);
      iVar2 = 0;
      if (pFVar4 != (FILE *)0x0) {
        fclose(pFVar4);
      }
      goto LAB_00103b10;
    }
    fwrite("input and output filenames must differ\n",0x27,1,_stderr);
  }
  else {
    puts(
        "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n"
        );
  }
  iVar2 = 0;
LAB_00103b10:
  memset(buffer,0,0x400);
  local_788[0] = 0;
  local_788[1] = 0;
  local_788[2] = 0;
  local_788[3] = 0;
  local_788[4] = 0;
  local_788[5] = 0;
  local_788[6] = 0;
  local_788[7] = 0;
  auStack_780[0] = '\0';
  auStack_780[1] = '\0';
  auStack_780[2] = '\0';
  auStack_780[3] = '\0';
  auStack_780[4] = '\0';
  auStack_780[5] = '\0';
  auStack_780[6] = '\0';
  auStack_780[7] = '\0';
  auStack_780[8] = '\0';
  auStack_780[9] = '\0';
  auStack_780[10] = '\0';
  auStack_780[0xb] = '\0';
  auStack_780[0xc] = '\0';
  auStack_780[0xd] = '\0';
  auStack_780[0xe] = '\0';
  auStack_780[0xf] = '\0';
  auStack_780[0x10] = '\0';
  auStack_780[0x11] = '\0';
  auStack_780[0x12] = '\0';
  auStack_780[0x13] = '\0';
  auStack_780[0x14] = '\0';
  auStack_780[0x15] = '\0';
  auStack_780[0x16] = '\0';
  auStack_780[0x17] = '\0';
  mbedtls_aes_free(&aes_ctx);
  mbedtls_md_free(&sha_ctx);
  return iVar2;
code_r0x00103862:
  tmp[0] = buffer[0];
  tmp[1] = buffer[1];
  tmp[2] = buffer[2];
  tmp[3] = buffer[3];
  tmp[4] = buffer[4];
  tmp[5] = buffer[5];
  tmp[6] = buffer[6];
  tmp[7] = buffer[7];
  tmp[8] = buffer[8];
  tmp[9] = buffer[9];
  tmp[10] = buffer[10];
  tmp[0xb] = buffer[0xb];
  tmp[0xc] = buffer[0xc];
  tmp[0xd] = buffer[0xd];
  tmp[0xe] = buffer[0xe];
  tmp[0xf] = buffer[0xf];
  mbedtls_md_hmac_update(&sha_ctx,buffer,0x10);
  mbedtls_aes_crypt_ecb(&aes_ctx,0,buffer,buffer);
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    buffer[lVar9] = buffer[lVar9] ^ local_7b8[lVar9];
  }
  sVar5 = 0x10;
  if (uVar6 == local_7c0) {
    sVar5 = (size_t)(uVar3 & 0xf);
  }
  local_7b8[0] = tmp[0];
  local_7b8[1] = tmp[1];
  local_7b8[2] = tmp[2];
  local_7b8[3] = tmp[3];
  local_7b8[4] = tmp[4];
  local_7b8[5] = tmp[5];
  local_7b8[6] = tmp[6];
  local_7b8[7] = tmp[7];
  uStack_7b0._0_1_ = tmp[8];
  uStack_7b0._1_1_ = tmp[9];
  uStack_7b0._2_1_ = tmp[10];
  uStack_7b0._3_1_ = tmp[0xb];
  uStack_7b0._4_1_ = tmp[0xc];
  uStack_7b0._5_1_ = tmp[0xd];
  uStack_7b0._6_1_ = tmp[0xe];
  bStack_7a9 = tmp[0xf];
  if ((char)(uVar3 & 0xf) == '\0') {
    sVar5 = 0x10;
  }
  n = (uint)sVar5;
  sVar5 = fwrite(buffer,1,sVar5,local_7e0);
  uVar10 = (ulong)n;
  uVar6 = uVar6 + 0x10;
  if (sVar5 != uVar10) goto code_r0x001038f4;
  goto LAB_0010383a;
code_r0x001038f4:
  pcVar13 = "fwrite(%d bytes) failed\n";
LAB_00103a9b:
  fprintf(_stderr,pcVar13,uVar10);
  __stream = local_7c8;
  pFVar4 = local_7e0;
  goto LAB_00103af9;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset(IV, 0, sizeof(IV));
    memset(key, 0, sizeof(key));
    memset(digest, 0, sizeof(digest));
    memset(buffer, 0, sizeof(buffer));

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key and clean the command line.
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

    memset( argv[4], 0, strlen( argv[4] ) );

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        unsigned char tmp[16];

        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );
        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}